

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

bool wallet::AllInputsMine(CWallet *wallet,CTransaction *tx,isminefilter *filter)

{
  long lVar1;
  bool bVar2;
  reference txin_00;
  isminetype *in_RDX;
  CWallet *in_RSI;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  isminetype in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RDI,(AnnotatedMixin<std::recursive_mutex> *)in_RSI,(char *)in_RDX,
             in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  do {
    bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_29 = true;
LAB_00394438:
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_29;
      }
      __stack_chk_fail();
    }
    txin_00 = __gnu_cxx::
              __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
              operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                         *)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff94 = InputIsMine(in_RSI,txin_00);
    if ((in_stack_ffffffffffffff94 & *in_RDX) == ISMINE_NO) {
      local_29 = false;
      goto LAB_00394438;
    }
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_ffffffffffffff88);
  } while( true );
}

Assistant:

bool AllInputsMine(const CWallet& wallet, const CTransaction& tx, const isminefilter& filter)
{
    LOCK(wallet.cs_wallet);
    for (const CTxIn& txin : tx.vin) {
        if (!(InputIsMine(wallet, txin) & filter)) return false;
    }
    return true;
}